

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O2

void vkt::createGlslTests(TestCaseGroup *glslTests)

{
  char *__s;
  char *__s_00;
  TestNode *this;
  TestContext *testCtx;
  TestCaseGroup *node;
  TestNode *pTVar1;
  long lVar2;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  TestNode *local_f8;
  TestContext *local_f0;
  long local_e8;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_e0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f0 = (glslTests->super_TestNode).m_testCtx;
  lVar2 = 8;
  local_f8 = &glslTests->super_TestNode;
  while (testCtx = local_f0, lVar2 != 0x98) {
    __s = *(char **)(&UNK_00bc7498 + lVar2);
    __s_00 = *(char **)((long)&createGlslTests::s_es310Tests[0].name + lVar2);
    local_e8 = lVar2;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_f9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,__s_00,&local_fa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"vulkan/glsl/es310/",&local_fb);
    std::operator+(&local_70,&local_90,__s);
    std::operator+(&local_50,&local_70,".test");
    createShaderLibraryGroup
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&local_e0,
               local_f0,&local_b0,&local_d0,&local_50);
    node = local_e0.m_data.ptr;
    local_e0.m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild(local_f8,&node->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&local_e0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    lVar2 = local_e8 + 0x10;
  }
  pTVar1 = &sr::createDerivateTests(local_f0)->super_TestNode;
  this = local_f8;
  tcu::TestNode::addChild(local_f8,pTVar1);
  pTVar1 = &sr::createDiscardTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createIndexingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createLoopTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createMatrixTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createOperatorTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createReturnTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createStructTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createSwitchTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createTextureFunctionTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createTextureGatherTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &sr::createBuiltinVarTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &shaderexecutor::createBuiltinTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = &shaderexecutor::createOpaqueTypeIndexingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(this,pTVar1);
  return;
}

Assistant:

void createGlslTests (tcu::TestCaseGroup* glslTests)
{
	tcu::TestContext&	testCtx		= glslTests->getTestContext();

	// ShaderLibrary-based tests
	static const struct
	{
		const char*		name;
		const char*		description;
	} s_es310Tests[] =
	{
		{ "arrays",						"Arrays"					},
		{ "conditionals",				"Conditional statements"	},
		{ "constant_expressions",		"Constant expressions"		},
		{ "constants",					"Constants"					},
		{ "conversions",				"Type conversions"			},
		{ "functions",					"Functions"					},
		{ "linkage",					"Linking"					},
		{ "scoping",					"Scoping"					},
		{ "swizzles",					"Swizzles"					},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_es310Tests); ndx++)
		glslTests->addChild(createShaderLibraryGroup(testCtx,
													 s_es310Tests[ndx].name,
													 s_es310Tests[ndx].description,
													 std::string("vulkan/glsl/es310/") + s_es310Tests[ndx].name + ".test").release());

	// ShaderRenderCase-based tests
	glslTests->addChild(sr::createDerivateTests			(testCtx));
	glslTests->addChild(sr::createDiscardTests			(testCtx));
	glslTests->addChild(sr::createIndexingTests			(testCtx));
	glslTests->addChild(sr::createLoopTests				(testCtx));
	glslTests->addChild(sr::createMatrixTests			(testCtx));
	glslTests->addChild(sr::createOperatorTests			(testCtx));
	glslTests->addChild(sr::createReturnTests			(testCtx));
	glslTests->addChild(sr::createStructTests			(testCtx));
	glslTests->addChild(sr::createSwitchTests			(testCtx));
	glslTests->addChild(sr::createTextureFunctionTests	(testCtx));
	glslTests->addChild(sr::createTextureGatherTests	(testCtx));
	glslTests->addChild(sr::createBuiltinVarTests		(testCtx));

	// ShaderExecutor-based tests
	glslTests->addChild(shaderexecutor::createBuiltinTests				(testCtx));
	glslTests->addChild(shaderexecutor::createOpaqueTypeIndexingTests	(testCtx));
}